

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_resilience_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::ErrorResilienceTestLarge_OnVersusOff_Test::
~ErrorResilienceTestLarge_OnVersusOff_Test(ErrorResilienceTestLarge_OnVersusOff_Test *this)

{
  anon_unknown.dwarf_767bfd::ErrorResilienceTestLarge::~ErrorResilienceTestLarge
            ((ErrorResilienceTestLarge *)(this + -0x18));
  operator_delete((ErrorResilienceTestLarge *)(this + -0x18));
  return;
}

Assistant:

TEST_P(ErrorResilienceTestLarge, OnVersusOff) {
  SetupEncoder(2000, 10);
  libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                     cfg_.g_timebase.den, cfg_.g_timebase.num,
                                     0, 12);

  // Global error resilient mode OFF.
  cfg_.g_error_resilient = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr_resilience_off = GetAveragePsnr();
  EXPECT_GT(psnr_resilience_off, 25.0);

  Reset();
  // Error resilient mode ON for certain frames
  unsigned int num_error_resilient_frames = 5;
  unsigned int error_resilient_frame_list[] = { 3, 5, 6, 9, 11 };
  SetErrorResilientFrames(num_error_resilient_frames,
                          error_resilient_frame_list);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr_resilience_on = GetAveragePsnr();
  EXPECT_GT(psnr_resilience_on, 25.0);

  // Test that turning on error resilient mode hurts by 10% at most.
  if (psnr_resilience_off > 0.0) {
    const double psnr_ratio = psnr_resilience_on / psnr_resilience_off;
    EXPECT_GE(psnr_ratio, 0.9);
    EXPECT_LE(psnr_ratio, 1.1);
  }
}